

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int jx9Builtin_file(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  uint uVar1;
  jx9_user_func *pjVar2;
  byte *zString;
  io_private *piVar3;
  io_private *piVar4;
  jx9_io_stream *pStream;
  io_private *pDev;
  jx9_value *pjVar5;
  jx9_value *pVal;
  void *pvVar6;
  long lVar7;
  byte *pbVar8;
  ushort **ppuVar9;
  char *pcVar10;
  byte *pbVar11;
  sxi32 iErr;
  jx9_vm *pVm;
  jx9_value *pResource;
  byte bVar12;
  SyBlob *pBlob;
  bool bVar13;
  uint local_6c;
  char *zBuf;
  io_private *local_50;
  io_private *local_48;
  char *zFile;
  int nLen;
  
  if ((nArg < 1) || (((*apArg)->iFlags & 1) == 0)) {
    pjVar2 = pCtx->pFunc;
    pVm = pCtx->pVm;
    pcVar10 = "Expecting a file path";
LAB_0013e8e3:
    iErr = 2;
  }
  else {
    zFile = jx9_value_to_string(*apArg,&nLen);
    pVm = pCtx->pVm;
    pStream = jx9VmGetStreamDevice(pVm,&zFile,nLen);
    if (pStream == (jx9_io_stream *)0x0) {
      pjVar2 = pCtx->pFunc;
      pcVar10 = "No such stream device, JX9 is returning FALSE";
      goto LAB_0013e8e3;
    }
    pDev = (io_private *)jx9_context_alloc_chunk(pCtx,0x38,1,0);
    pVm = pCtx->pVm;
    if (pDev != (io_private *)0x0) {
      local_6c = 0;
      pDev->pStream = pStream;
      (pDev->sBuffer).pBlob = (void *)0x0;
      (pDev->sBuffer).nByte = 0;
      (pDev->sBuffer).mByte = 0;
      (pDev->sBuffer).pAllocator = &pVm->sAllocator;
      (pDev->sBuffer).nFlags = 0;
      pDev->nOfft = 0;
      pDev->iMagic = 0xfeac14;
      local_50 = pDev;
      if (nArg != 1) {
        pjVar5 = apArg[1];
        jx9MemObjToInteger(pjVar5);
        local_6c = *(uint *)&pjVar5->x;
      }
      pjVar5 = jx9_context_new_array(pCtx);
      pVal = jx9_context_new_scalar(pCtx);
      pcVar10 = zFile;
      pVm = pCtx->pVm;
      if (pVal != (jx9_value *)0x0 && pjVar5 != (jx9_value *)0x0) {
        if (nArg < 3) {
          pResource = (jx9_value *)0x0;
        }
        else {
          pResource = apArg[2];
        }
        pvVar6 = jx9StreamOpenHandle(pVm,pStream,zFile,1,local_6c & 1,pResource,0,(int *)0x0);
        pDev->pHandle = pvVar6;
        if (pvVar6 != (void *)0x0) {
          lVar7 = StreamReadLine(pDev,&zBuf,-1);
          piVar4 = pDev;
          zString = (byte *)zBuf;
          piVar3 = local_48;
          do {
            local_48 = piVar4;
            if (lVar7 < 1) {
              pBlob = &local_50->sBuffer;
              local_48 = piVar3;
              if (pStream->xClose != (_func_void_void_ptr *)0x0) {
                (*pStream->xClose)(pDev->pHandle);
              }
              SyBlobRelease(pBlob);
              pDev->iMagic = 0x2126;
              jx9_context_free_chunk(pCtx,pDev);
              jx9_result_value(pCtx,pjVar5);
              return 0;
            }
            (pVal->sBlob).nByte = 0;
            uVar1 = (pVal->sBlob).nFlags;
            if ((uVar1 & 4) != 0) {
              (pVal->sBlob).pBlob = (void *)0x0;
              (pVal->sBlob).mByte = 0;
              (pVal->sBlob).nFlags = uVar1 & 0xfffffffb;
            }
            pbVar8 = zString + lVar7;
            pbVar11 = pbVar8;
            if ((local_6c & 2) != 0) {
              do {
                pbVar8 = pbVar11;
                if (pbVar8 <= zString) break;
                pbVar11 = pbVar8 + -1;
              } while (pbVar8[-1] == 10);
            }
            zBuf = (char *)zString;
            if ((local_6c & 4) == 0) {
LAB_0013eae0:
              jx9_value_string(pVal,(char *)zString,(int)pbVar8 - (int)zString);
              if ((pjVar5->iFlags & 0x40) != 0) {
                HashmapInsert((jx9_hashmap *)(pjVar5->x).pOther,(jx9_value *)0x0,pVal);
              }
            }
            else {
              bVar13 = zString < pbVar8;
              if (bVar13) {
                bVar12 = *zString;
                if (bVar12 < 0xc0) {
                  ppuVar9 = __ctype_b_loc();
                  pbVar11 = zString;
                  do {
                    pbVar11 = pbVar11 + 1;
                    if ((*(byte *)((long)*ppuVar9 + (long)(char)bVar12 * 2 + 1) & 0x20) == 0) break;
                    bVar13 = pbVar11 < pbVar8;
                    if (pbVar11 == pbVar8) goto LAB_0013eb54;
                    bVar12 = *pbVar11;
                  } while (bVar12 < 0xc0);
                }
                if (bVar13) goto LAB_0013eae0;
              }
            }
LAB_0013eb54:
            pDev = local_48;
            lVar7 = StreamReadLine(local_48,&zBuf,-1);
            piVar4 = local_48;
            zString = (byte *)zBuf;
            piVar3 = local_48;
          } while( true );
        }
        jx9_context_throw_error_format(pCtx,1,"IO error while opening \'%s\'",pcVar10);
        goto LAB_0013e8ed;
      }
    }
    pjVar2 = pCtx->pFunc;
    pcVar10 = "JX9 is running out of memory";
    iErr = 1;
  }
  jx9VmThrowError(pVm,&pjVar2->sName,iErr,pcVar10);
LAB_0013e8ed:
  pjVar5 = pCtx->pRet;
  jx9MemObjRelease(pjVar5);
  (pjVar5->x).rVal = 0.0;
  pjVar5->iFlags = pjVar5->iFlags & 0xfffffe90U | 8;
  return 0;
}

Assistant:

static int jx9Builtin_file(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zFile, *zPtr, *zEnd, *zBuf;
	jx9_value *pArray, *pLine;
	const jx9_io_stream *pStream;
	int use_include = 0;
	io_private *pDev;
	jx9_int64 n;
	int iFlags;
	int nLen;
	
	if( nArg < 1 || !jx9_value_is_string(apArg[0]) ){
		/* Missing/Invalid arguments, return FALSE */
		jx9_context_throw_error(pCtx, JX9_CTX_WARNING, "Expecting a file path");
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Extract the file path */
	zFile = jx9_value_to_string(apArg[0], &nLen);
	/* Point to the target IO stream device */
	pStream = jx9VmGetStreamDevice(pCtx->pVm, &zFile, nLen);
	if( pStream == 0 ){
		jx9_context_throw_error(pCtx, JX9_CTX_WARNING, "No such stream device, JX9 is returning FALSE");
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Allocate a new IO private instance */
	pDev = (io_private *)jx9_context_alloc_chunk(pCtx, sizeof(io_private), TRUE, FALSE);
	if( pDev == 0 ){
		jx9_context_throw_error(pCtx, JX9_CTX_ERR, "JX9 is running out of memory");
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Initialize the structure */
	InitIOPrivate(pCtx->pVm, pStream, pDev);
	iFlags = 0;
	if( nArg > 1 ){
		iFlags = jx9_value_to_int(apArg[1]);
	}
	if( iFlags & 0x01 /*FILE_USE_INCLUDE_PATH*/ ){
		use_include = TRUE;
	}
	/* Create the array and the working value */
	pArray = jx9_context_new_array(pCtx);
	pLine = jx9_context_new_scalar(pCtx);
	if( pArray == 0 || pLine == 0 ){
		jx9_context_throw_error(pCtx, JX9_CTX_ERR, "JX9 is running out of memory");
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Try to open the file in read-only mode */
	pDev->pHandle = jx9StreamOpenHandle(pCtx->pVm, pStream, zFile, JX9_IO_OPEN_RDONLY, use_include, nArg > 2 ? apArg[2] : 0, FALSE, 0);
	if( pDev->pHandle == 0 ){
		jx9_context_throw_error_format(pCtx, JX9_CTX_ERR, "IO error while opening '%s'", zFile);
		jx9_result_bool(pCtx, 0);
		/* Don't worry about freeing memory, everything will be released automatically
		 * as soon we return from this function.
		 */
		return JX9_OK;
	}
	/* Perform the requested operation */
	for(;;){
		/* Try to extract a line */
		n = StreamReadLine(pDev, &zBuf, -1);
		if( n < 1 ){
			/* EOF or IO error */
			break;
		}
		/* Reset the cursor */
		jx9_value_reset_string_cursor(pLine);
		/* Remove line ending if requested by the caller */
		zPtr = zBuf;
		zEnd = &zBuf[n];
		if( iFlags & 0x02 /* FILE_IGNORE_NEW_LINES */ ){
			/* Ignore trailig lines */
			while( zPtr < zEnd && (zEnd[-1] == '\n' 
#ifdef __WINNT__
				|| zEnd[-1] == '\r'
#endif
				)){
					n--;
					zEnd--;
			}
		}
		if( iFlags & 0x04 /* FILE_SKIP_EMPTY_LINES */ ){
			/* Ignore empty lines */
			while( zPtr < zEnd && (unsigned char)zPtr[0] < 0xc0 && SyisSpace(zPtr[0]) ){
				zPtr++;
			}
			if( zPtr >= zEnd ){
				/* Empty line */
				continue;
			}
		}
		jx9_value_string(pLine, zBuf, (int)(zEnd-zBuf));
		/* Insert line */
		jx9_array_add_elem(pArray, 0/* Automatic index assign*/, pLine);
	}
	/* Close the stream */
	jx9StreamCloseHandle(pStream, pDev->pHandle);
	/* Release the io_private instance */
	ReleaseIOPrivate(pCtx, pDev);
	/* Return the created array */
	jx9_result_value(pCtx, pArray);
	return JX9_OK;
}